

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O3

void __thiscall twitter::zipkin::thrift::Annotation::printTo(Annotation *this,ostream *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Annotation(",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(out,"timestamp=",10);
  apache::thrift::to_string<long>(&local_40,&this->timestamp);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_40._M_dataplus._M_p,local_40._M_string_length);
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"value=",6);
  apache::thrift::to_string<std::__cxx11::string>(&local_40,(thrift *)&this->value,t);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"host=",5);
  if (((byte)this->__isset & 4) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    apache::thrift::to_string<twitter::zipkin::thrift::Endpoint>(&local_40,&this->host);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_40._M_dataplus._M_p,local_40._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void Annotation::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "Annotation(";
  out << "timestamp=" << to_string(timestamp);
  out << ", " << "value=" << to_string(value);
  out << ", " << "host="; (__isset.host ? (out << to_string(host)) : (out << "<null>"));
  out << ")";
}